

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::remap_descriptor_set_layout_handle
          (Impl *this,VkDescriptorSetLayout layout,VkDescriptorSetLayout *out_layout)

{
  bool bVar1;
  LogLevel LVar2;
  pointer pvVar3;
  VkDescriptorSetLayout_T *pVVar4;
  _Node_iterator_base<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_false> local_38;
  _Node_iterator_base<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_false> local_30;
  const_iterator itr;
  VkDescriptorSetLayout *out_layout_local;
  VkDescriptorSetLayout layout_local;
  Impl *this_local;
  
  if (layout == (VkDescriptorSetLayout)0x0) {
    *out_layout = (VkDescriptorSetLayout)0x0;
    this_local._7_1_ = true;
  }
  else {
    itr.super__Node_iterator_base<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_false>.
    _M_cur = (_Node_iterator_base<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_false>)
             (_Node_iterator_base<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_false>)
             out_layout;
    out_layout_local = (VkDescriptorSetLayout *)layout;
    layout_local = (VkDescriptorSetLayout)this;
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<VkDescriptorSetLayout_T_*,_unsigned_long,_std::hash<VkDescriptorSetLayout_T_*>,_std::equal_to<VkDescriptorSetLayout_T_*>,_std::allocator<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>_>_>
         ::find(&this->descriptor_set_layout_to_hash,(key_type *)&out_layout_local);
    local_38._M_cur =
         (__node_type *)
         std::
         end<std::unordered_map<VkDescriptorSetLayout_T*,unsigned_long,std::hash<VkDescriptorSetLayout_T*>,std::equal_to<VkDescriptorSetLayout_T*>,std::allocator<std::pair<VkDescriptorSetLayout_T*const,unsigned_long>>>>
                   (&this->descriptor_set_layout_to_hash);
    bVar1 = std::__detail::operator==(&local_30,&local_38);
    if (bVar1) {
      LVar2 = get_thread_log_level();
      if (((int)LVar2 < 2) &&
         (bVar1 = Internal::log_thread_callback
                            (LOG_DEFAULT,
                             "Cannot find descriptor set layout in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
                            ), !bVar1)) {
        fprintf(_stderr,
                "Fossilize WARN: Cannot find descriptor set layout in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
               );
      }
      this_local._7_1_ = false;
    }
    else {
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_false,_false>
                             *)&local_30);
      pVVar4 = api_object_cast<VkDescriptorSetLayout_T*,unsigned_long>(pvVar3->second);
      *(VkDescriptorSetLayout_T **)
       itr.
       super__Node_iterator_base<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_false>.
       _M_cur = pVVar4;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::Impl::remap_descriptor_set_layout_handle(VkDescriptorSetLayout layout,
                                                             VkDescriptorSetLayout *out_layout) const
{
	if (layout == VK_NULL_HANDLE)
	{
		// This is allowed in VK_EXT_graphics_pipeline_library.
		*out_layout = VK_NULL_HANDLE;
		return true;
	}

	auto itr = descriptor_set_layout_to_hash.find(layout);
	if (itr == end(descriptor_set_layout_to_hash))
	{
		LOGW_LEVEL("Cannot find descriptor set layout in hashmap.\n"
		           "Object has either not been recorded, or it was not supported by Fossilize.\n");
		return false;
	}
	else
	{
		*out_layout = api_object_cast<VkDescriptorSetLayout>(uint64_t(itr->second));
		return true;
	}
}